

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O0

void EMIT_OP_REG_REG(CodeGenGenericContext *ctx,x86Command op,x86Reg reg1,x86XmmReg reg2)

{
  x86Argument arg;
  x86Reg reg;
  CodeGenGenericContext *this;
  x86Argument local_40;
  x86XmmReg local_1c;
  x86Reg local_18;
  x86XmmReg reg2_local;
  x86Reg reg1_local;
  x86Command op_local;
  CodeGenGenericContext *ctx_local;
  
  local_1c = reg2;
  local_18 = reg1;
  reg2_local = op;
  _reg1_local = ctx;
  if (op == o_movd) {
    local_1c = CodeGenGenericContext::RedirectRegister(ctx,reg2);
    CodeGenGenericContext::ReadRegister(_reg1_local,local_1c);
    this = _reg1_local;
    reg = local_18;
    x86Argument::x86Argument(&local_40,local_1c);
    arg.field_1.imm64Arg = local_40.field_1.imm64Arg;
    arg.type = local_40.type;
    arg._4_4_ = local_40._4_4_;
    arg.ptrBase = local_40.ptrBase;
    arg.ptrIndex = local_40.ptrIndex;
    arg.ptrMult = local_40.ptrMult;
    arg.ptrNum = local_40.ptrNum;
    CodeGenGenericContext::OverwriteRegisterWithValue(this,reg,arg);
    _reg1_local->x86Op->name = reg2_local;
    (_reg1_local->x86Op->argA).type = argReg;
    (_reg1_local->x86Op->argA).field_1.reg = local_18;
    (_reg1_local->x86Op->argB).type = argXmmReg;
    (_reg1_local->x86Op->argB).field_1.xmmArg = local_1c;
    _reg1_local->x86Op = _reg1_local->x86Op + 1;
    return;
  }
  __assert_fail("!\"unknown instruction\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                ,0x59b,
                "void EMIT_OP_REG_REG(CodeGenGenericContext &, x86Command, x86Reg, x86XmmReg)");
}

Assistant:

void EMIT_OP_REG_REG(CodeGenGenericContext &ctx, x86Command op, x86Reg reg1, x86XmmReg reg2)
{
#ifdef NULLC_OPTIMIZE_X86
	switch(op)
	{
	case o_movd:
		reg2 = ctx.RedirectRegister(reg2);

		ctx.ReadRegister(reg2);
		ctx.OverwriteRegisterWithValue(reg1, x86Argument(reg2));
		break;
	default:
		assert(!"unknown instruction");
	}
#endif

	ctx.x86Op->name = op;
	ctx.x86Op->argA.type = x86Argument::argReg;
	ctx.x86Op->argA.reg = reg1;
	ctx.x86Op->argB.type = x86Argument::argXmmReg;
	ctx.x86Op->argB.xmmArg = reg2;
	ctx.x86Op++;
}